

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O0

GLfloat circleCenter(DelaunayTriangulation *delTri,GLsizei i_a,GLsizei i_b,GLsizei i_c,
                    GLfloat *center)

{
  GLfloat (*paGVar1) [2];
  GLfloat (*paGVar2) [2];
  GLfloat (*paGVar3) [2];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  GLfloat dy;
  GLfloat dx;
  GLfloat d;
  GLfloat dy_ab;
  GLfloat dy_ca;
  GLfloat dy_bc;
  GLfloat cc;
  GLfloat bb;
  GLfloat aa;
  GLfloat *c;
  GLfloat *b;
  GLfloat *a;
  GLfloat *point;
  GLfloat *center_local;
  GLsizei i_c_local;
  GLsizei i_b_local;
  GLsizei i_a_local;
  DelaunayTriangulation *delTri_local;
  
  paGVar1 = delTri->points + i_a;
  paGVar2 = delTri->points + i_b;
  paGVar3 = delTri->points + i_c;
  fVar4 = (*paGVar1)[0] * (*paGVar1)[0] + (*paGVar1)[1] * (*paGVar1)[1];
  fVar5 = (*paGVar2)[0] * (*paGVar2)[0] + (*paGVar2)[1] * (*paGVar2)[1];
  fVar6 = (*paGVar3)[0] * (*paGVar3)[0] + (*paGVar3)[1] * (*paGVar3)[1];
  fVar7 = (*paGVar2)[1] - (*paGVar3)[1];
  fVar8 = (*paGVar3)[1] - (*paGVar1)[1];
  fVar9 = (*paGVar1)[1] - (*paGVar2)[1];
  fVar10 = ((*paGVar3)[0] * fVar9 + (*paGVar1)[0] * fVar7 + (*paGVar2)[0] * fVar8) * 2.0;
  *center = (fVar6 * fVar9 + fVar4 * fVar7 + fVar5 * fVar8) / fVar10;
  center[1] = (fVar6 * ((*paGVar2)[0] - (*paGVar1)[0]) +
              fVar4 * ((*paGVar3)[0] - (*paGVar2)[0]) + fVar5 * ((*paGVar1)[0] - (*paGVar3)[0])) /
              fVar10;
  fVar4 = (*paGVar1)[0] - *center;
  fVar5 = (*paGVar1)[1] - center[1];
  dVar11 = sqrt((double)(fVar4 * fVar4 + fVar5 * fVar5));
  return (float)dVar11;
}

Assistant:

GLfloat circleCenter(DelaunayTriangulation *delTri, GLsizei i_a, GLsizei i_b, GLsizei i_c, GLfloat center[2]) {
	// https://www.codewars.com/kata/5705785658b58f387b001ffc
	GLfloat *point, *a, *b, *c;
	a = delTri->points[i_a];
	b = delTri->points[i_b];
	c = delTri->points[i_c];
	GLfloat aa, bb, cc, dy_bc, dy_ca, dy_ab, d;

	aa = a[0] * a[0] + a[1] * a[1];
	bb = b[0] * b[0] + b[1] * b[1];
	cc = c[0] * c[0] + c[1] * c[1];

	dy_bc = b[1] - c[1];
	dy_ca = c[1] - a[1];
	dy_ab = a[1] - b[1];

	d = 2 * (a[0] * dy_bc + b[0] * dy_ca + c[0] * dy_ab);

	center[0] = (aa * dy_bc + bb * dy_ca + cc * dy_ab) / d;
	// WARNING: there is an error is the link, it is Bx - Ax (and not the opposite)
	center[1] = (aa * (c[0] - b[0]) + bb * (a[0] - c[0]) + cc * (b[0] - a[0])) / d;

	GLfloat dx, dy;

	dx = a[0] - center[0];
	dy = a[1] - center[1];

	return sqrt(dx * dx + dy * dy);
}